

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

int __thiscall
Signal<std::shared_ptr<Transcript>_>::ConnectMember<Model>
          (Signal<std::shared_ptr<Transcript>_> *this,Model *inst,offset_in_Model_to_subr func)

{
  int iVar1;
  anon_class_24_2_3f47e9d7 local_70;
  function<void_(std::shared_ptr<Transcript>)> local_58;
  offset_in_Model_to_subr local_38;
  offset_in_Model_to_subr func_local;
  Model *local_28;
  Model *inst_local;
  Signal<std::shared_ptr<Transcript>_> *this_local;
  
  local_70.inst = inst;
  local_70.func = func;
  local_38 = func;
  local_28 = inst;
  inst_local = (Model *)this;
  this_local = (Signal<std::shared_ptr<Transcript>_> *)func;
  std::function<void(std::shared_ptr<Transcript>)>::
  function<Signal<std::shared_ptr<Transcript>>::ConnectMember<Model>(Model*,void(Model::*)(std::shared_ptr<Transcript>))::_lambda(std::shared_ptr<Transcript>)_1_,void>
            ((function<void(std::shared_ptr<Transcript>)> *)&local_58,&local_70);
  iVar1 = Connect(this,&local_58);
  std::function<void_(std::shared_ptr<Transcript>)>::~function(&local_58);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }